

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_SizeBytesAgree_Test<pstore::uint128>::TestBody
          (SparseArray_SizeBytesAgree_Test<pstore::uint128> *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  pointer psVar2;
  char *pcVar3;
  initializer_list<unsigned_long> indices;
  initializer_list<unsigned_long> indices_00;
  initializer_list<unsigned_long> indices_01;
  initializer_list<unsigned_int> values;
  initializer_list<unsigned_int> values_00;
  initializer_list<unsigned_int> values_01;
  AssertHelper local_1d0;
  Message local_1c8;
  size_t local_1c0;
  initializer_list<unsigned_int> local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 *local_178;
  iterator local_170;
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  local_168;
  size_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  size_t local_138;
  initializer_list<unsigned_int> local_130;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 *local_110;
  iterator local_108;
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  local_100;
  size_t local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  size_t local_d0;
  initializer_list<unsigned_int> local_c8;
  undefined8 local_b8;
  undefined8 *local_b0;
  iterator local_a8;
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  local_a0;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  size_t local_70 [3];
  pair<unsigned_int,_unsigned_int> *local_58;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_50;
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  local_48;
  size_t local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  empty;
  SparseArray_SizeBytesAgree_Test<pstore::uint128> *this_local;
  
  this_00 = &gtest_ar.message_;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)this_00);
  local_50._M_current =
       (pair<unsigned_int,_unsigned_int> *)
       std::
       begin<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                 ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)this_00);
  local_58 = (pair<unsigned_int,_unsigned_int> *)
             std::
             end<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                       ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)this_00);
  pstore::sparse_array<unsigned_int,pstore::uint128>::
  make_unique<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
            ((sparse_array<unsigned_int,pstore::uint128> *)&local_48,local_50,
             (__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
              )local_58);
  psVar2 = std::
           unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
           ::operator->(&local_48);
  local_40 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(psVar2);
  local_70[0] = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_38,
             "(sparse_array<unsigned, TypeParam>::make_unique (std::begin (empty), std::end (empty)) ->size_bytes ())"
             ,"(sparse_array<unsigned, TypeParam>::size_bytes (0))",&local_40,local_70);
  std::
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  ::~unique_ptr(&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x125,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_b8 = 0;
  local_b0 = &local_b8;
  local_a8 = (iterator)0x1;
  std::initializer_list<unsigned_int>::initializer_list(&local_c8);
  indices._M_len = (size_type)local_b0;
  indices._M_array = (iterator)&local_a0;
  values._M_len = (size_type)local_c8._M_array;
  values._M_array = local_a8;
  pstore::sparse_array<unsigned_int,_pstore::uint128>::make_unique(indices,values);
  psVar2 = std::
           unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
           ::operator->(&local_a0);
  local_98 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(psVar2);
  local_d0 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(1);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_90,
             "(sparse_array<unsigned, TypeParam>::make_unique ({0})->size_bytes ())",
             "(sparse_array<unsigned, TypeParam>::size_bytes (1))",&local_98,&local_d0);
  std::
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  ::~unique_ptr(&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_120 = 1;
  local_118 = 3;
  local_110 = &local_120;
  local_108 = (iterator)0x2;
  std::initializer_list<unsigned_int>::initializer_list(&local_130);
  indices_00._M_len = (size_type)local_110;
  indices_00._M_array = (iterator)&local_100;
  values_00._M_len = (size_type)local_130._M_array;
  values_00._M_array = local_108;
  pstore::sparse_array<unsigned_int,_pstore::uint128>::make_unique(indices_00,values_00);
  psVar2 = std::
           unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
           ::operator->(&local_100);
  local_f8 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(psVar2);
  local_138 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(2);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_f0,
             "(sparse_array<unsigned, TypeParam>::make_unique ({1, 3})->size_bytes ())",
             "(sparse_array<unsigned, TypeParam>::size_bytes (2))",&local_f8,&local_138);
  std::
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  ::~unique_ptr(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x12a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_198 = 5;
  uStack_190 = 7;
  local_1a8 = 1;
  uStack_1a0 = 3;
  local_188 = 0xb;
  local_178 = &local_1a8;
  local_170 = (iterator)0x5;
  std::initializer_list<unsigned_int>::initializer_list(&local_1b8);
  indices_01._M_len = (size_type)local_178;
  indices_01._M_array = (iterator)&local_168;
  values_01._M_len = (size_type)local_1b8._M_array;
  values_01._M_array = local_170;
  pstore::sparse_array<unsigned_int,_pstore::uint128>::make_unique(indices_01,values_01);
  psVar2 = std::
           unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
           ::operator->(&local_168);
  local_160 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(psVar2);
  local_1c0 = pstore::sparse_array<unsigned_int,_pstore::uint128>::size_bytes(5);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_158,
             "(sparse_array<unsigned, TypeParam>::make_unique ({1, 3, 5, 7, 11})->size_bytes ())",
             "(sparse_array<unsigned, TypeParam>::size_bytes (5))",&local_160,&local_1c0);
  std::
  unique_ptr<pstore::sparse_array<unsigned_int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<unsigned_int,_pstore::uint128>_>_>
  ::~unique_ptr(&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,300,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST (SparseArray, SizeBytesAgree) {
    std::vector<std::pair<unsigned, unsigned>> empty;
    EXPECT_EQ (
        (sparse_array<unsigned, TypeParam>::make_unique (std::begin (empty), std::end (empty))
             ->size_bytes ()),
        (sparse_array<unsigned, TypeParam>::size_bytes (0)));

    EXPECT_EQ ((sparse_array<unsigned, TypeParam>::make_unique ({0})->size_bytes ()),
               (sparse_array<unsigned, TypeParam>::size_bytes (1)));
    EXPECT_EQ ((sparse_array<unsigned, TypeParam>::make_unique ({1, 3})->size_bytes ()),
               (sparse_array<unsigned, TypeParam>::size_bytes (2)));
    EXPECT_EQ ((sparse_array<unsigned, TypeParam>::make_unique ({1, 3, 5, 7, 11})->size_bytes ()),
               (sparse_array<unsigned, TypeParam>::size_bytes (5)));
}